

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

void __thiscall
cmCTestCoverageHandler::SetLabelFilter
          (cmCTestCoverageHandler *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *labels)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  int local_2c;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->LabelFilter)._M_t);
  p_Var1 = (labels->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(labels->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      local_2c = GetLabelId(this,(string *)(p_Var1 + 1));
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(&(this->LabelFilter)._M_t,&local_2c);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void cmCTestCoverageHandler::SetLabelFilter(
  std::set<std::string> const& labels)
{
  this->LabelFilter.clear();
  for (std::set<std::string>::const_iterator li = labels.begin();
       li != labels.end(); ++li) {
    this->LabelFilter.insert(this->GetLabelId(*li));
  }
}